

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswIslands.c
# Opt level: O1

int Ssw_SecWithSimilarity(Aig_Man_t *p0,Aig_Man_t *p1,Ssw_Pars_t *pPars)

{
  int iVar1;
  Vec_Int_t *vPairs;
  Aig_Man_t *pPart1;
  Aig_Man_t *pPart0;
  Aig_Man_t *local_28;
  Aig_Man_t *local_20;
  
  if (pPars->fVerbose != 0) {
    Abc_Print((int)p0,"Performing sequential verification using structural similarity.\n");
  }
  if (p1 == (Aig_Man_t *)0x0) {
    if (pPars->fVerbose != 0) {
      Aig_ManPrintStats(p0);
    }
    iVar1 = Saig_ManDemiterSimpleDiff(p0,&local_20,&local_28);
    if (iVar1 == 0) {
      Abc_Print((int)p0,"Demitering has failed.\n");
      return -1;
    }
  }
  else {
    local_20 = Aig_ManDupSimple(p0);
    local_28 = Aig_ManDupSimple(p1);
  }
  if (local_20->nRegs < 1) {
    __assert_fail("Aig_ManRegNum(pPart0) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswIslands.c"
                  ,0x243,"int Ssw_SecWithSimilarity(Aig_Man_t *, Aig_Man_t *, Ssw_Pars_t *)");
  }
  if (0 < local_28->nRegs) {
    if (local_20->nTruePis != local_28->nTruePis) {
      __assert_fail("Saig_ManPiNum(pPart0) == Saig_ManPiNum(pPart1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswIslands.c"
                    ,0x245,"int Ssw_SecWithSimilarity(Aig_Man_t *, Aig_Man_t *, Ssw_Pars_t *)");
    }
    if (local_20->nTruePos == local_28->nTruePos) {
      vPairs = Saig_StrSimPerformMatching(local_20,local_28,0,pPars->fVerbose,(Aig_Man_t **)0x0);
      iVar1 = Ssw_SecWithSimilarityPairs(local_20,local_28,vPairs,pPars);
      Aig_ManStop(local_20);
      Aig_ManStop(local_28);
      if (vPairs->pArray != (int *)0x0) {
        free(vPairs->pArray);
        vPairs->pArray = (int *)0x0;
      }
      if (vPairs != (Vec_Int_t *)0x0) {
        free(vPairs);
      }
      return iVar1;
    }
    __assert_fail("Saig_ManPoNum(pPart0) == Saig_ManPoNum(pPart1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswIslands.c"
                  ,0x246,"int Ssw_SecWithSimilarity(Aig_Man_t *, Aig_Man_t *, Ssw_Pars_t *)");
  }
  __assert_fail("Aig_ManRegNum(pPart1) > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswIslands.c"
                ,0x244,"int Ssw_SecWithSimilarity(Aig_Man_t *, Aig_Man_t *, Ssw_Pars_t *)");
}

Assistant:

int Ssw_SecWithSimilarity( Aig_Man_t * p0, Aig_Man_t * p1, Ssw_Pars_t * pPars )
{
    Vec_Int_t * vPairs;
    Aig_Man_t * pPart0, * pPart1;
    int RetValue;
    if ( pPars->fVerbose )
        Abc_Print( 1, "Performing sequential verification using structural similarity.\n" );
    // consider the case when a miter is given
    if ( p1 == NULL )
    {
        if ( pPars->fVerbose )
        {
            Aig_ManPrintStats( p0 );
        }
        // demiter the miter
        if ( !Saig_ManDemiterSimpleDiff( p0, &pPart0, &pPart1 ) )
        {
            Abc_Print( 1, "Demitering has failed.\n" );
            return -1;
        }
    }
    else
    {
        pPart0 = Aig_ManDupSimple( p0 );
        pPart1 = Aig_ManDupSimple( p1 );
    }
    if ( pPars->fVerbose )
    {
//        Aig_ManPrintStats( pPart0 );
//        Aig_ManPrintStats( pPart1 );
        if ( p1 == NULL )
        {
//        Aig_ManDumpBlif( pPart0, "part0.blif", NULL, NULL );
//        Aig_ManDumpBlif( pPart1, "part1.blif", NULL, NULL );
//        Abc_Print( 1, "The result of demitering is written into files \"%s\" and \"%s\".\n", "part0.blif", "part1.blif" );
        }
    }
    assert( Aig_ManRegNum(pPart0) > 0 );
    assert( Aig_ManRegNum(pPart1) > 0 );
    assert( Saig_ManPiNum(pPart0) == Saig_ManPiNum(pPart1) );
    assert( Saig_ManPoNum(pPart0) == Saig_ManPoNum(pPart1) );
    // derive pairs
//    vPairs = Saig_StrSimPerformMatching_hack( pPart0, pPart1 );
    vPairs = Saig_StrSimPerformMatching( pPart0, pPart1, 0, pPars->fVerbose, NULL );
    RetValue = Ssw_SecWithSimilarityPairs( pPart0, pPart1, vPairs, pPars );
    Aig_ManStop( pPart0 );
    Aig_ManStop( pPart1 );
    Vec_IntFree( vPairs );
    return RetValue;
}